

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O1

_Bool X86_lockrep(MCInst *MI,SStream *O)

{
  uint8_t uVar1;
  ushort uVar2;
  unsigned_short uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  _Bool _Var7;
  char *pcVar8;
  
  uVar1 = MI->x86_prefix[0];
  if (uVar1 == 0xf3) {
    uVar4 = MCInst_getOpcode(MI);
    uVar3 = insn_find(insns,0x1726,uVar4,&MI->csh->insn_cache);
    if (uVar3 == 0) goto switchD_001aad18_caseD_1d1;
    uVar2 = insns[uVar3].mapid;
    if (uVar2 < 0x1cf) {
      if (uVar2 < 0x149) {
        if (((uVar2 - 0xd9 < 5) && ((0x19U >> (uVar2 - 0xd9 & 0x1f) & 1) != 0)) || (uVar2 == 0x148))
        goto switchD_001aad18_caseD_1cf;
      }
      else {
        if (uVar2 - 0x14a < 2) goto switchD_001aad18_caseD_1cf;
        if (uVar2 == 0x149) {
          uVar5 = 0x517;
          goto LAB_001aad51;
        }
      }
    }
    else if (uVar2 < 0x1ea) {
      switch(uVar2) {
      case 0x1cf:
      case 0x1d3:
      case 0x1d5:
switchD_001aad18_caseD_1cf:
        pcVar8 = "rep|";
        goto LAB_001aae2a;
      case 0x1d0:
        uVar5 = 0x6ae;
LAB_001aad51:
        if (uVar4 == uVar5) goto switchD_001aad18_caseD_1cf;
      }
    }
    else if (uVar2 < 0x29c) {
      if ((uVar2 - 0x1ea < 3) || (uVar2 == 0x29b)) goto switchD_001aad18_caseD_1cf;
    }
    else {
      if (uVar2 - 0x29d < 2) goto switchD_001aad18_caseD_1cf;
      if (uVar2 == 0x29c) {
        uVar5 = 0xab1;
        goto LAB_001aad51;
      }
    }
switchD_001aad18_caseD_1d1:
    uVar3 = insn_find(insns,0x1726,uVar4,&MI->csh->insn_cache);
    if (uVar3 != 0) {
      uVar2 = insns[uVar3].mapid;
      if (uVar2 < 0x266) {
        switch(uVar2) {
        case 0x60:
        case 0x62:
        case 100:
switchD_001aadb1_caseD_60:
          pcVar8 = "repe|";
LAB_001aae2a:
          _Var7 = false;
          SStream_concat(O,pcVar8);
          add_cx(MI);
          goto LAB_001aae74;
        case 0x61:
          uVar5 = 0x233;
LAB_001aadd8:
          if (uVar4 == uVar5) goto switchD_001aadb1_caseD_60;
        }
      }
      else {
        if ((uVar2 - 0x268 < 2) || (uVar2 == 0x266)) goto switchD_001aadb1_caseD_60;
        if (uVar2 == 0x267) {
          uVar5 = 0x9f2;
          goto LAB_001aadd8;
        }
      }
    }
    MI->x86_prefix[0] = '\0';
    if (uVar4 == 0x6e9) {
      MCInst_setOpcode(MI,0x6f2);
      pcVar8 = "mulss\t";
LAB_001aae63:
      SStream_concat(O,pcVar8);
      _Var7 = true;
      goto LAB_001aae74;
    }
  }
  else if (uVar1 == 0xf2) {
    uVar4 = MCInst_getOpcode(MI);
    uVar3 = insn_find(insns,0x1726,uVar4,&MI->csh->insn_cache);
    if (uVar3 != 0) {
      uVar2 = insns[uVar3].mapid;
      if (uVar2 < 0x1cf) {
        switch(uVar2) {
        case 0x60:
        case 0x62:
        case 100:
switchD_001aae18_caseD_60:
          pcVar8 = "repne|";
          goto LAB_001aae2a;
        case 0x61:
          uVar5 = 0x233;
LAB_001aae1f:
          if (uVar4 == uVar5) goto switchD_001aae18_caseD_60;
          break;
        case 99:
          break;
        default:
          if (uVar2 - 0x148 < 4) goto switchD_001aae18_caseD_60;
          uVar5 = uVar2 - 0xd9;
          if (uVar5 < 5) {
            uVar6 = 0x19;
            goto LAB_001aacf2;
          }
        }
      }
      else {
        uVar5 = uVar2 - 0x266;
        if (uVar5 < 0x39) {
          if ((0x1e000000000000dU >> ((ulong)uVar5 & 0x3f) & 1) != 0)
          goto switchD_001aae18_caseD_60;
          if ((ulong)uVar5 == 1) {
            uVar5 = 0x9f2;
            goto LAB_001aae1f;
          }
        }
        uVar5 = uVar2 - 0x1cf;
        if (uVar5 < 0x1e) {
          uVar6 = 0x38000053;
LAB_001aacf2:
          if ((uVar6 >> (uVar5 & 0x1f) & 1) != 0) goto switchD_001aae18_caseD_60;
        }
      }
    }
    MI->x86_prefix[0] = '\0';
    if (uVar4 == 0x6e9) {
      MCInst_setOpcode(MI,0x6ee);
      pcVar8 = "mulsd\t";
      goto LAB_001aae63;
    }
  }
  else if (uVar1 == 0xf0) {
    _Var7 = false;
    SStream_concat(O,"lock|");
    goto LAB_001aae74;
  }
  _Var7 = false;
LAB_001aae74:
  if (MI->csh->detail != CS_OPT_OFF) {
    *(undefined4 *)(MI->flat_insn->detail->field_6).x86.prefix = *(undefined4 *)MI->x86_prefix;
  }
  return _Var7;
}

Assistant:

bool X86_lockrep(MCInst *MI, SStream *O)
{
	unsigned int opcode;
	bool res = false;

	switch(MI->x86_prefix[0]) {
		default:
			break;
		case 0xf0:
#ifndef CAPSTONE_DIET
			SStream_concat(O, "lock|");
#endif
			break;
		case 0xf2:	// repne
			opcode = MCInst_getOpcode(MI);
#ifndef CAPSTONE_DIET	// only care about memonic in standard (non-diet) mode
			if (valid_repne(MI->csh, opcode)) {
				SStream_concat(O, "repne|");
				add_cx(MI);
			} else {
				// invalid prefix
				MI->x86_prefix[0] = 0;

				// handle special cases
#ifndef CAPSTONE_X86_REDUCE
				if (opcode == X86_MULPDrr) {
					MCInst_setOpcode(MI, X86_MULSDrr);
					SStream_concat(O, "mulsd\t");
					res = true;
				}
#endif
			}
#else	// diet mode -> only patch opcode in special cases
			if (!valid_repne(MI->csh, opcode)) {
				MI->x86_prefix[0] = 0;
			}
#ifndef CAPSTONE_X86_REDUCE
			// handle special cases
			if (opcode == X86_MULPDrr) {
				MCInst_setOpcode(MI, X86_MULSDrr);
			}
#endif
#endif
			break;

		case 0xf3:
			opcode = MCInst_getOpcode(MI);
#ifndef CAPSTONE_DIET	// only care about memonic in standard (non-diet) mode
			if (valid_rep(MI->csh, opcode)) {
				SStream_concat(O, "rep|");
				add_cx(MI);
			} else if (valid_repe(MI->csh, opcode)) {
				SStream_concat(O, "repe|");
				add_cx(MI);
			} else {
				// invalid prefix
				MI->x86_prefix[0] = 0;

				// handle special cases
#ifndef CAPSTONE_X86_REDUCE
				if (opcode == X86_MULPDrr) {
					MCInst_setOpcode(MI, X86_MULSSrr);
					SStream_concat(O, "mulss\t");
					res = true;
				}
#endif
			}
#else	// diet mode -> only patch opcode in special cases
			if (!valid_rep(MI->csh, opcode) && !valid_repe(MI->csh, opcode)) {
				MI->x86_prefix[0] = 0;
			}
#ifndef CAPSTONE_X86_REDUCE
			// handle special cases
			if (opcode == X86_MULPDrr) {
				MCInst_setOpcode(MI, X86_MULSSrr);
			}
#endif
#endif
			break;
	}

	// copy normalized prefix[] back to x86.prefix[]
	if (MI->csh->detail)
		memcpy(MI->flat_insn->detail->x86.prefix, MI->x86_prefix, ARR_SIZE(MI->x86_prefix));

	return res;
}